

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

SmallNormalHeapBlockT<MediumAllocationBlockAttributes> * __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
GetUnusedHeapBlock(HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                   *this)

{
  uint32 *puVar1;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  code *pcVar2;
  bool bVar3;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *pSVar4;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *pSVar5;
  undefined4 *puVar6;
  
  pSVar5 = this->emptyBlockList;
  if (pSVar5 == (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pSVar5 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::New(this);
    if ((this->super_HeapBucket).emptyHeapBlockCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x2fd,"(this->emptyHeapBlockCount == 0)","this->emptyHeapBlockCount == 0")
      ;
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  else {
    this_00 = (pSVar5->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (this_00 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      pSVar4 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar4 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&this_00->super_HeapBlock);
    }
    this->emptyBlockList = pSVar4;
    puVar1 = &(this->super_HeapBucket).emptyHeapBlockCount;
    *puVar1 = *puVar1 - 1;
  }
  return pSVar5;
}

Assistant:

TBlockType*
HeapBucketT<TBlockType>::GetUnusedHeapBlock()
{
    // Add a new heap block
    TBlockType * heapBlock = emptyBlockList;
    if (heapBlock == nullptr)
    {
        // We couldn't find a reusable heap block
        heapBlock = TBlockType::New(this);
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        Assert(this->emptyHeapBlockCount == 0);
#endif
    }
    else
    {
        emptyBlockList = heapBlock->GetNextBlock();
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        this->emptyHeapBlockCount--;
#endif
    }
    return heapBlock;
}